

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O1

int test_deserialize(char *filename)

{
  size_t in_RAX;
  FILE *__stream;
  char *buf;
  roaring_bitmap_t *r;
  size_t sVar1;
  char *buf_00;
  size_t a;
  int iVar2;
  size_t bytes;
  size_t local_38;
  
  local_38 = in_RAX;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Could not open %s, check your configuration. \n",filename);
    _assert_true(0,"fp == NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
                 ,0x34);
  }
  buf = readfile((FILE *)__stream,&local_38);
  if (buf == (char *)0x0) {
    printf("Could not read bytes from %s, check your configuration. \n",filename);
    _assert_true(0,"input_buffer == NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
                 ,0x3c);
  }
  puts("Binary content read.");
  r = roaring_bitmap_portable_deserialize_safe(buf,local_38);
  if (r == (roaring_bitmap_t *)0x0) {
    puts("Null bitmap loaded.");
    free(buf);
    iVar2 = 1;
  }
  else {
    puts("Non-null bitmap loaded.");
    sVar1 = roaring_bitmap_portable_size_in_bytes(r);
    buf_00 = (char *)malloc(sVar1);
    a = roaring_bitmap_portable_serialize(r,buf_00);
    if (a != sVar1) {
      free(buf);
      free(buf_00);
      _assert_int_equal(a,sVar1,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
                        ,0x53);
    }
    if (a != 0) {
      sVar1 = 0;
      do {
        if (buf[sVar1] != buf_00[sVar1]) {
          iVar2 = (int)sVar1 + 1;
          goto LAB_0010289e;
        }
        sVar1 = sVar1 + 1;
      } while (a != sVar1);
    }
    iVar2 = 0;
LAB_0010289e:
    free(buf_00);
    free(buf);
    fclose(__stream);
    roaring_bitmap_free(r);
    _assert_true((ulong)(iVar2 == 0),"compare_result",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
                 ,0x5d);
  }
  return iVar2;
}

Assistant:

int test_deserialize(const char* filename) {
    FILE* fp = fopen(filename, "rb");
    if (fp == NULL) {
        printf("Could not open %s, check your configuration. \n", filename);
        assert_false(fp == NULL);
    }
    size_t bytes;
    char* input_buffer = readfile(fp, &bytes);

    if (input_buffer == NULL) {
        printf("Could not read bytes from %s, check your configuration. \n",
               filename);
        assert_false(input_buffer == NULL);
    }
    printf("Binary content read.\n");

    roaring_bitmap_t* bitmap =
        roaring_bitmap_portable_deserialize_safe(input_buffer, bytes);

    if (bitmap == NULL) {
        printf("Null bitmap loaded.\n");
        free(input_buffer);
        return 1;  // this is the expected behavior
    }
    printf("Non-null bitmap loaded.\n");

    size_t expected_size = roaring_bitmap_portable_size_in_bytes(bitmap);

    char* output_buffer = (char*)malloc(expected_size);
    size_t actual_size =
        roaring_bitmap_portable_serialize(bitmap, output_buffer);

    if (actual_size != expected_size) {
        free(input_buffer);
        free(output_buffer);
        assert_int_equal(actual_size, expected_size);
    }

    int compare_result = compare(input_buffer, output_buffer, actual_size);

    free(output_buffer);
    free(input_buffer);
    fclose(fp);

    roaring_bitmap_free(bitmap);
    assert_false(compare_result);

    return compare_result;
}